

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall
QWidgetTextControl::setExtraSelections
          (QWidgetTextControl *this,QList<QTextEdit::ExtraSelection> *selections)

{
  QList<QAbstractTextDocumentLayout::Selection> *this_00;
  ExtraSelection *pEVar1;
  const_iterator it;
  char cVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  pointer pSVar7;
  long lVar8;
  int i;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long in_FS_OFFSET;
  QRectF local_88;
  const_iterator local_68;
  int local_4c;
  QMultiHash<int,_int> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar8 = *(long *)(this + 8);
  local_48.d = (Data *)0x0;
  local_48.m_size = 0;
  iVar3 = 0;
  while (local_68.i.d = (Data<QHashPrivate::MultiNode<int,_int>_> *)
                        CONCAT44(local_68.i.d._4_4_,iVar3), (long)iVar3 < *(long *)(lVar8 + 0x130))
  {
    local_4c = QTextCursor::anchor();
    QMultiHash<int,int>::emplace<int_const&>
              ((iterator *)&local_88,&local_48,&local_4c,(int *)&local_68);
    iVar3 = (int)local_68.i.d + 1;
  }
  lVar9 = 0;
  uVar10 = 0;
  do {
    if ((ulong)(selections->d).size <= uVar10) {
      this_00 = (QList<QAbstractTextDocumentLayout::Selection> *)(lVar8 + 0x120);
      local_68.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
      local_68.i.d = (Data<QHashPrivate::MultiNode<int,_int>_> *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
      QMultiHash<int,_int>::cbegin(&local_68,&local_48);
      while (local_68.e != (Chain **)0x0) {
        lVar9 = *(long *)(lVar8 + 0x128);
        lVar11 = (long)(*local_68.e)->value * 0x18;
        local_88.w = -NAN;
        local_88.h._0_4_ = 0xffffffff;
        local_88.h._4_4_ = 0xffffffff;
        local_88.xp = -NAN;
        local_88.yp._0_4_ = 0xffffffff;
        local_88.yp._4_4_ = 0xffffffff;
        selectionRect(&local_88,this,(QTextCursor *)(lVar9 + lVar11));
        cVar2 = QTextFormat::boolProperty((int)lVar9 + (int)lVar11 + 8);
        if (cVar2 != '\0') {
          local_88.xp = (0.0 - local_88.xp) + local_88.xp;
          local_88.w = 2147483647.0;
        }
        updateRequest(this,&local_88);
        QMultiHash<int,_int>::const_iterator::operator++(&local_68);
      }
      QList<QAbstractTextDocumentLayout::Selection>::resize(this_00,(selections->d).size);
      lVar8 = 0;
      for (uVar10 = 0; uVar10 < (ulong)(selections->d).size; uVar10 = uVar10 + 1) {
        pEVar1 = (selections->d).ptr;
        pSVar7 = QList<QAbstractTextDocumentLayout::Selection>::data(this_00);
        QTextCursor::operator=(&pSVar7->cursor + lVar8,&pEVar1->cursor + lVar8);
        pEVar1 = (selections->d).ptr;
        pSVar7 = QList<QAbstractTextDocumentLayout::Selection>::data(this_00);
        QTextFormat::operator=
                  (&(pSVar7->format).super_QTextFormat + lVar8,
                   &(pEVar1->format).super_QTextFormat + lVar8);
        lVar8 = lVar8 + 0x18;
      }
      QMultiHash<int,_int>::~QMultiHash(&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    pEVar1 = (selections->d).ptr;
    local_68.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
    local_68.i.d = (Data<QHashPrivate::MultiNode<int,_int>_> *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    uVar4 = QTextCursor::anchor();
    local_88.xp = (qreal)CONCAT44(local_88.xp._4_4_,uVar4);
    QMultiHash<int,_int>::constFindImpl<int>(&local_68,&local_48,(int *)&local_88);
    if (local_68.e == (Chain **)0x0) {
LAB_0048258e:
      local_88.w = -NAN;
      local_88.h._0_4_ = 0xffffffff;
      local_88.h._4_4_ = 0xffffffff;
      local_88.xp = -NAN;
      local_88.yp._0_4_ = 0xffffffff;
      local_88.yp._4_4_ = 0xffffffff;
      selectionRect(&local_88,this,&pEVar1->cursor + lVar9);
      cVar2 = QTextFormat::boolProperty((int)pEVar1 + (int)lVar9 + 8);
      if (cVar2 != '\0') {
        local_88.xp = (0.0 - local_88.xp) + local_88.xp;
        local_88.w = 2147483647.0;
      }
      updateRequest(this,&local_88);
    }
    else {
      iVar3 = (*local_68.e)->value;
      lVar11 = *(long *)(lVar8 + 0x128);
      iVar5 = QTextCursor::position();
      iVar6 = QTextCursor::position();
      if (iVar5 != iVar6) goto LAB_0048258e;
      cVar2 = QTextFormat::operator==
                        ((QTextFormat *)((long)iVar3 * 0x18 + lVar11 + 8),
                         &(pEVar1->format).super_QTextFormat + lVar9);
      if (cVar2 == '\0') goto LAB_0048258e;
      it.i.bucket = local_68.i.bucket;
      it.i.d = local_68.i.d;
      it.e = local_68.e;
      QMultiHash<int,_int>::erase((iterator *)&local_88,&local_48,it);
    }
    uVar10 = uVar10 + 1;
    lVar9 = lVar9 + 0x18;
  } while( true );
}

Assistant:

void QWidgetTextControl::setExtraSelections(const QList<QTextEdit::ExtraSelection> &selections)
{
    Q_D(QWidgetTextControl);

    QMultiHash<int, int> hash;
    for (int i = 0; i < d->extraSelections.size(); ++i) {
        const QAbstractTextDocumentLayout::Selection &esel = d->extraSelections.at(i);
        hash.insert(esel.cursor.anchor(), i);
    }

    for (int i = 0; i < selections.size(); ++i) {
        const QTextEdit::ExtraSelection &sel = selections.at(i);
        const auto it = hash.constFind(sel.cursor.anchor());
        if (it != hash.cend()) {
            const QAbstractTextDocumentLayout::Selection &esel = d->extraSelections.at(it.value());
            if (esel.cursor.position() == sel.cursor.position()
                && esel.format == sel.format) {
                hash.erase(it);
                continue;
            }
        }
        QRectF r = selectionRect(sel.cursor);
        if (sel.format.boolProperty(QTextFormat::FullWidthSelection)) {
            r.setLeft(0);
            r.setWidth(qreal(INT_MAX));
        }
        emit updateRequest(r);
    }

    for (auto it = hash.cbegin(); it != hash.cend(); ++it) {
        const QAbstractTextDocumentLayout::Selection &esel = d->extraSelections.at(it.value());
        QRectF r = selectionRect(esel.cursor);
        if (esel.format.boolProperty(QTextFormat::FullWidthSelection)) {
            r.setLeft(0);
            r.setWidth(qreal(INT_MAX));
        }
        emit updateRequest(r);
    }

    d->extraSelections.resize(selections.size());
    for (int i = 0; i < selections.size(); ++i) {
        d->extraSelections[i].cursor = selections.at(i).cursor;
        d->extraSelections[i].format = selections.at(i).format;
    }
}